

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O0

void CheckStackTrace(int i)

{
  void **v1;
  void **v2;
  int local_90;
  int j;
  CheckOpString local_80;
  LogMessage local_78;
  string *local_18;
  _Check_string *_result;
  int i_local;
  
  expected_range[5].start = (void *)0x10b0b0;
  expected_range[5].end = (void *)0x10b0e2;
  _result._4_4_ = i;
  v1 = google::GetReferenceableValue<void_const*>(&expected_range[5].start);
  v2 = google::GetReferenceableValue<void_const*>(&expected_range[5].end);
  local_18 = google::Check_LTImpl<void_const*,void_const*>
                       (v1,v2,"(&expected_range[5])->start < (&expected_range[5])->end");
  if (local_18 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_80,local_18);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0xda,&local_80);
    google::LogMessage::stream(&local_78);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
  }
  local_18 = (string *)0x0;
  for (local_90 = _result._4_4_; -1 < local_90; local_90 = local_90 + -1) {
    CheckStackTrace1(local_90);
  }
  return;
}

Assistant:

void ATTRIBUTE_NOINLINE
    CheckStackTrace(int i) {
  INIT_ADDRESS_RANGE(CheckStackTrace, start, end, &expected_range[5]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace1(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}